

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O2

uint8_t * __thiscall NodeBTree::parseData(NodeBTree *this,KeyType *key,uint8_t *data)

{
  byte bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint8_t *local_28;
  
  bVar1 = *data;
  local_28 = data + 1;
  key->m_flags = (uint)bVar1;
  uVar3 = decodeBitsAndAdvance(&local_28);
  key->m_nodeIndex = (uint32_t)uVar3;
  uVar3 = decodeBitsAndAdvance(&local_28);
  uVar2 = (uint32_t)uVar3;
  key->m_size1 = uVar2;
  if ((bVar1 & 0xf) != 0) {
    uVar3 = decodeBitsAndAdvance(&local_28);
    uVar2 = (uint32_t)uVar3;
  }
  key->m_size2 = uVar2;
  uVar2 = 0;
  if (this->m_hasMultipleVolumes == true) {
    uVar3 = decodeBitsAndAdvance(&local_28);
    uVar2 = (uint32_t)uVar3;
  }
  key->m_volumeIndex = uVar2;
  uVar3 = decodeBitsAndAdvance(&local_28);
  key->m_sectorIndex = (uint32_t)uVar3;
  return local_28;
}

Assistant:

const uint8_t* parseData(KeyType& key, const uint8_t* data) const
	{
		const auto flags = readNext<uint8_t>(data);
		key.setFlags(flags);
		
		const auto nodeIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		key.setNodeIndex(nodeIndex);

		const auto size1 = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		key.setSize1(size1);
		
		// TODO: figure out
		const auto size2 = key.hasBits0123() ? static_cast<uint32_t>(decodeBitsAndAdvance(data)) : size1;
		key.setSize2(size2);
		
		if (m_hasMultipleVolumes) {
			const auto volumeIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
			key.setVolumeIndex(volumeIndex);
		} else {
			key.setVolumeIndex(0);
		}
		
		const auto sectorIndex = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		key.setSectorIndex(sectorIndex);
		
		return data;
	}